

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void prvTidyParseDefList(TidyDocImpl *doc,Node *list,GetTokenMode mode)

{
  Lexer *pLVar1;
  Node *pNVar2;
  bool bVar3;
  Bool BVar4;
  Node *pNStack_38;
  Bool discardIt;
  Node *parent;
  Node *node;
  Lexer *lexer;
  Node *pNStack_18;
  GetTokenMode mode_local;
  Node *list_local;
  TidyDocImpl *doc_local;
  
  pLVar1 = doc->lexer;
  if ((list->tag->model & 1) != 0) {
    return;
  }
  pLVar1->insert = (IStack *)0x0;
  pNStack_18 = list;
LAB_00145356:
  do {
    while( true ) {
      while( true ) {
        do {
          parent = prvTidyGetToken(doc,IgnoreWhitespace);
          if (parent == (Node *)0x0) {
            prvTidyReport(doc,pNStack_18,(Node *)0x0,600);
            return;
          }
          if ((parent->tag == pNStack_18->tag) && (parent->type == EndTag)) {
            prvTidyFreeNode(doc,parent);
            pNStack_18->closed = yes;
            return;
          }
          BVar4 = InsertMisc(pNStack_18,parent);
        } while (BVar4 != no);
        BVar4 = prvTidynodeIsText(parent);
        if (BVar4 != no) {
          prvTidyUngetToken(doc);
          parent = prvTidyInferredTag(doc,TidyTag_DT);
          prvTidyReport(doc,pNStack_18,parent,0x25f);
        }
        if (parent->tag != (Dict *)0x0) break;
        prvTidyReport(doc,pNStack_18,parent,0x233);
        prvTidyFreeNode(doc,parent);
      }
      if (parent->type == EndTag) break;
LAB_0014554c:
      if (((parent == (Node *)0x0) || (parent->tag == (Dict *)0x0)) ||
         (parent->tag->id != TidyTag_CENTER)) {
        if ((((parent == (Node *)0x0) || (parent->tag == (Dict *)0x0)) ||
            (parent->tag->id != TidyTag_DT)) &&
           (((parent == (Node *)0x0 || (parent->tag == (Dict *)0x0)) ||
            (parent->tag->id != TidyTag_DD)))) {
          prvTidyUngetToken(doc);
          if ((parent->tag->model & 0x18) == 0) {
            prvTidyReport(doc,pNStack_18,parent,0x27c);
            return;
          }
          if (((parent->tag->model & 0x10) == 0) && (pLVar1->excludeBlocks != no)) {
            return;
          }
          parent = prvTidyInferredTag(doc,TidyTag_DD);
          prvTidyReport(doc,pNStack_18,parent,0x25f);
        }
        if (parent->type == EndTag) {
          prvTidyReport(doc,pNStack_18,parent,0x233);
          prvTidyFreeNode(doc,parent);
        }
        else {
          prvTidyInsertNodeAtEnd(pNStack_18,parent);
          ParseTag(doc,parent,IgnoreWhitespace);
        }
      }
      else {
        if (pNStack_18->content == (Node *)0x0) {
          prvTidyInsertNodeBeforeElement(pNStack_18,parent);
        }
        else {
          prvTidyInsertNodeAfterElement(pNStack_18,parent);
        }
        pNVar2 = parent->parent;
        pLVar1->excludeBlocks = no;
        ParseTag(doc,parent,mode);
        pLVar1->excludeBlocks = yes;
        if (pNVar2->last == parent) {
          pNStack_18 = prvTidyInferredTag(doc,TidyTag_DL);
          prvTidyInsertNodeAfterElement(parent,pNStack_18);
        }
      }
    }
    bVar3 = false;
    if (((parent == (Node *)0x0) || (parent->tag == (Dict *)0x0)) ||
       (parent->tag->id != TidyTag_FORM)) {
      for (pNStack_38 = pNStack_18->parent; pNStack_38 != (Node *)0x0;
          pNStack_38 = pNStack_38->parent) {
        if (((pNStack_38 != (Node *)0x0) && (pNStack_38->tag != (Dict *)0x0)) &&
           (pNStack_38->tag->id == TidyTag_BODY)) {
          bVar3 = true;
          break;
        }
        if (parent->tag == pNStack_38->tag) {
          prvTidyReport(doc,pNStack_18,parent,599);
          prvTidyUngetToken(doc);
          return;
        }
      }
      if (!bVar3) goto LAB_0014554c;
      prvTidyReport(doc,pNStack_18,parent,0x233);
      prvTidyFreeNode(doc,parent);
      goto LAB_00145356;
    }
    BadForm(doc);
    prvTidyReport(doc,pNStack_18,parent,0x233);
    prvTidyFreeNode(doc,parent);
  } while( true );
}

Assistant:

void TY_(ParseDefList)(TidyDocImpl* doc, Node *list, GetTokenMode mode)
{
    Lexer* lexer = doc->lexer;
    Node *node, *parent;

    if (list->tag->model & CM_EMPTY)
        return;

    lexer->insert = NULL;  /* defer implicit inline start tags */

    while ((node = TY_(GetToken)( doc, IgnoreWhitespace)) != NULL)
    {
        if (node->tag == list->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            list->closed = yes;
            return;
        }

        /* deal with comments etc. */
        if (InsertMisc(list, node))
            continue;

        if (TY_(nodeIsText)(node))
        {
            TY_(UngetToken)( doc );
            node = TY_(InferredTag)(doc, TidyTag_DT);
            TY_(Report)(doc, list, node, MISSING_STARTTAG);
        }

        if (node->tag == NULL)
        {
            TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /* 
          if this is the end tag for an ancestor element
          then infer end tag for this element
        */
        if (node->type == EndTag)
        {
            Bool discardIt = no;
            if ( nodeIsFORM(node) )
            {
                BadForm( doc );
                TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node );
                continue;
            }

            for (parent = list->parent;
                    parent != NULL; parent = parent->parent)
            {
               /* Do not match across BODY to avoid infinite loop
                  between ParseBody and this parser,
                  See http://tidy.sf.net/bug/1098012. */
                if (nodeIsBODY(parent))
                {
                    discardIt = yes;
                    break;
                }
                if (node->tag == parent->tag)
                {
                    TY_(Report)(doc, list, node, MISSING_ENDTAG_BEFORE);

                    TY_(UngetToken)( doc );
                    return;
                }
            }
            if (discardIt)
            {
                TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }
        }

        /* center in a dt or a dl breaks the dl list in two */
        if ( nodeIsCENTER(node) )
        {
            if (list->content)
                TY_(InsertNodeAfterElement)(list, node);
            else /* trim empty dl list */
            {
                TY_(InsertNodeBeforeElement)(list, node);
            }

            /* #426885 - fix by Glenn Carroll 19 Apr 00, and
                         Gary Dechaines 11 Aug 00 */
            /* ParseTag can destroy node, if it finds that
             * this <center> is followed immediately by </center>.
             * It's awkward but necessary to determine if this
             * has happened.
             */
            parent = node->parent;

            /* and parse contents of center */
            lexer->excludeBlocks = no;
            ParseTag( doc, node, mode);
            lexer->excludeBlocks = yes;

            /* now create a new dl element,
             * unless node has been blown away because the
             * center was empty, as above.
             */
            if (parent->last == node)
            {
                list = TY_(InferredTag)(doc, TidyTag_DL);
                TY_(InsertNodeAfterElement)(node, list);
            }
            continue;
        }

        if ( !(nodeIsDT(node) || nodeIsDD(node)) )
        {
            TY_(UngetToken)( doc );

            if (!(node->tag->model & (CM_BLOCK | CM_INLINE)))
            {
                TY_(Report)(doc, list, node, TAG_NOT_ALLOWED_IN);
                return;
            }

            /* if DD appeared directly in BODY then exclude blocks */
            if (!(node->tag->model & CM_INLINE) && lexer->excludeBlocks)
                return;

            node = TY_(InferredTag)(doc, TidyTag_DD);
            TY_(Report)(doc, list, node, MISSING_STARTTAG);
        }

        if (node->type == EndTag)
        {
            TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }
        
        /* node should be <DT> or <DD>*/
        TY_(InsertNodeAtEnd)(list, node);
        ParseTag( doc, node, IgnoreWhitespace);
    }

    TY_(Report)(doc, list, node, MISSING_ENDTAG_FOR);
}